

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrent_heterogeneous_queue_basic_tests.cpp
# Opt level: O0

void density_tests::conc_heterogeneous_queue_lifetime_tests(void)

{
  bool bVar1;
  runtime_type<> *prVar2;
  int *piVar3;
  allocator_type *paVar4;
  conc_heter_queue<density::runtime_type<>,_density_tests::move_only_void_allocator>
  *const_move_only_queue;
  int local_120 [2];
  undefined1 local_118 [7];
  allocator_type allocator_copy;
  conc_heter_queue<density::runtime_type<>,_density_tests::move_only_void_allocator> move_only_queue
  ;
  undefined1 local_d8 [7];
  move_only_void_allocator movable_alloc;
  undefined1 local_b8 [8];
  consume_operation cons;
  type other_queue;
  int local_4c;
  undefined1 local_48 [8];
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue;
  default_allocator allocator;
  
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)local_48,(basic_default_allocator<65536UL> *)((long)&queue.m_queue.m_tail + 7)
                  );
  local_4c = 1;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
            )local_48,&local_4c);
  other_queue.m_queue.m_tail._0_4_ = 2;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
            )local_48,(int *)&other_queue.m_queue.m_tail);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)&cons.m_consume_operation.m_control,
                   (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)local_48);
  bVar1 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                 *)local_48);
  if ((!bVar1) ||
     (bVar1 = density::
              conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
              ::empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)&cons.m_consume_operation.m_control), bVar1)) {
    detail::assert_failed<>
              ("queue.empty() && !other_queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/concurrent_heterogeneous_queue_basic_tests.cpp"
               ,0x20);
  }
  density::swap((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                 *)local_48,
                (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                 *)&cons.m_consume_operation.m_control);
  bVar1 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                 *)local_48);
  if ((bVar1) ||
     (bVar1 = density::
              conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
              ::empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)&cons.m_consume_operation.m_control), !bVar1)) {
    detail::assert_failed<>
              ("!queue.empty() && other_queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/concurrent_heterogeneous_queue_basic_tests.cpp"
               ,0x24);
  }
  density::swap((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                 *)local_48,
                (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                 *)&cons.m_consume_operation.m_control);
  bVar1 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                 *)local_48);
  if ((!bVar1) ||
     (bVar1 = density::
              conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
              ::empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)&cons.m_consume_operation.m_control), bVar1)) {
    detail::assert_failed<>
              ("queue.empty() && !other_queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/concurrent_heterogeneous_queue_basic_tests.cpp"
               ,0x26);
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_consume((consume_operation *)local_b8,
                    (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&cons.m_consume_operation.m_control);
  bVar1 = density::conc_heter_queue::consume_operation::operator_cast_to_bool
                    ((consume_operation *)local_b8);
  if (bVar1) {
    prVar2 = density::
             conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             consume_operation::complete_type((consume_operation *)local_b8);
    bVar1 = density::runtime_type<>::is<int>(prVar2);
    if ((!bVar1) ||
       (piVar3 = density::
                 conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                 ::consume_operation::element<int>((consume_operation *)local_b8), *piVar3 != 1))
    goto LAB_029da469;
  }
  else {
LAB_029da469:
    detail::assert_failed<>
              ("cons && cons.complete_type().is<int>() && cons.element<int>() == 1",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/concurrent_heterogeneous_queue_basic_tests.cpp"
               ,0x28);
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::commit((consume_operation *)local_b8);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_consume((consume_operation *)local_d8,
                    (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&cons.m_consume_operation.m_control);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::operator=((consume_operation *)local_b8,(consume_operation *)local_d8);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation((consume_operation *)local_d8);
  bVar1 = density::conc_heter_queue::consume_operation::operator_cast_to_bool
                    ((consume_operation *)local_b8);
  if (bVar1) {
    prVar2 = density::
             conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             consume_operation::complete_type((consume_operation *)local_b8);
    bVar1 = density::runtime_type<>::is<int>(prVar2);
    if ((bVar1) &&
       (piVar3 = density::
                 conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                 ::consume_operation::element<int>((consume_operation *)local_b8), *piVar3 == 2))
    goto LAB_029da531;
  }
  detail::assert_failed<>
            ("cons && cons.complete_type().is<int>() && cons.element<int>() == 2",
             "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/concurrent_heterogeneous_queue_basic_tests.cpp"
             ,0x2b);
LAB_029da531:
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::commit((consume_operation *)local_b8);
  bVar1 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                 *)&cons.m_consume_operation.m_control);
  if (!bVar1) {
    detail::assert_failed<>
              ("other_queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/concurrent_heterogeneous_queue_basic_tests.cpp"
               ,0x2d);
  }
  move_only_void_allocator::move_only_void_allocator
            ((move_only_void_allocator *)((long)&move_only_queue.m_queue.m_tail + 7),5);
  density::conc_heter_queue<density::runtime_type<>,_density_tests::move_only_void_allocator>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density_tests::move_only_void_allocator>
                    *)local_118,
                   (move_only_void_allocator *)((long)&move_only_queue.m_queue.m_tail + 7));
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  get_allocator((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                 *)&cons.m_consume_operation.m_control);
  local_120[0] = 1;
  density::conc_heter_queue<density::runtime_type<>,_density_tests::move_only_void_allocator>::
  push<int>((conc_heter_queue<density::runtime_type<>,_density_tests::move_only_void_allocator> *)
            local_118,local_120);
  const_move_only_queue._4_4_ = 2;
  density::conc_heter_queue<density::runtime_type<>,_density_tests::move_only_void_allocator>::
  push<int>((conc_heter_queue<density::runtime_type<>,_density_tests::move_only_void_allocator> *)
            local_118,(int *)((long)&const_move_only_queue + 4));
  paVar4 = density::
           conc_heter_queue<density::runtime_type<>,_density_tests::move_only_void_allocator>::
           get_allocator_ref((conc_heter_queue<density::runtime_type<>,_density_tests::move_only_void_allocator>
                              *)local_118);
  move_only_void_allocator::dummy_func(paVar4);
  paVar4 = density::
           conc_heter_queue<density::runtime_type<>,_density_tests::move_only_void_allocator>::
           get_allocator_ref((conc_heter_queue<density::runtime_type<>,_density_tests::move_only_void_allocator>
                              *)local_118);
  move_only_void_allocator::const_dummy_func(paVar4);
  density::conc_heter_queue<density::runtime_type<>,_density_tests::move_only_void_allocator>::
  ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density_tests::move_only_void_allocator>
                     *)local_118);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation((consume_operation *)local_b8);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&cons.m_consume_operation.m_control);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)local_48);
  return;
}

Assistant:

void conc_heterogeneous_queue_lifetime_tests()
    {
        using namespace density;

        {
            default_allocator  allocator;
            conc_heter_queue<> queue(allocator); // copy construct allocator
            queue.push(1);
            queue.push(2);

            auto other_queue(std::move(queue)); // move construct queue - the source becomes empty
            DENSITY_TEST_ASSERT(queue.empty() && !other_queue.empty());

            // test swaps
            swap(queue, other_queue);
            DENSITY_TEST_ASSERT(!queue.empty() && other_queue.empty());
            swap(queue, other_queue);
            DENSITY_TEST_ASSERT(queue.empty() && !other_queue.empty());
            auto cons = other_queue.try_start_consume();
            DENSITY_TEST_ASSERT(cons && cons.complete_type().is<int>() && cons.element<int>() == 1);
            cons.commit();
            cons = other_queue.try_start_consume();
            DENSITY_TEST_ASSERT(cons && cons.complete_type().is<int>() && cons.element<int>() == 2);
            cons.commit();
            DENSITY_TEST_ASSERT(other_queue.empty());

            // test allocator getters
            move_only_void_allocator                                   movable_alloc(5);
            conc_heter_queue<runtime_type<>, move_only_void_allocator> move_only_queue(
              std::move(movable_alloc));

            auto allocator_copy = other_queue.get_allocator();
            (void)allocator_copy;

            move_only_queue.push(1);
            move_only_queue.push(2);

            move_only_queue.get_allocator_ref().dummy_func();

            auto const & const_move_only_queue(move_only_queue);
            const_move_only_queue.get_allocator_ref().const_dummy_func();
        }

        //move_only_void_allocator
    }